

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>::Construct
                   (DB *db,LIST *params)

{
  IfcMappedItem *in;
  
  in = (IfcMappedItem *)operator_new(0x48);
  *(undefined8 *)&in->field_0x38 = 0;
  *(char **)&in->field_0x40 = "IfcMappedItem";
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined ***)in = &PTR__IfcMappedItem_008467f8;
  *(undefined ***)&(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).field_0x20
       = &PTR__IfcMappedItem_00846848;
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcMappedItem_00846820;
  *(undefined8 *)&(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).field_0x10 =
       0;
  *(undefined8 *)&(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).field_0x18 =
       0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcMappedItem>(db,params,in);
  return (Object *)(&in->field_0x0 + *(long *)(*(long *)in + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }